

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int StartThreadSBGx(SBG *pSBG)

{
  int iVar1;
  int local_1c;
  int id;
  SBG *pSBG_local;
  
  local_1c = 0;
  do {
    if ((SBG *)addrsSBG[local_1c] == pSBG) {
      resSBG[local_1c] = 1;
      bExitSBG[local_1c] = 0;
      memset(sbgdataSBG,0,0x11b0);
      InitCriticalSection(SBGCS + local_1c);
      iVar1 = CreateDefaultThread(SBGThread,pSBG,SBGThreadId + local_1c);
      return iVar1;
    }
    local_1c = local_1c + 1;
  } while (local_1c < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int StartThreadSBGx(SBG* pSBG)
{
	int id = 0;

	while (addrsSBG[id] != pSBG)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	resSBG[id] = EXIT_FAILURE;
	bExitSBG[id] = FALSE;
	memset(&sbgdataSBG, 0, sizeof(SBGDATA));
	InitCriticalSection(&SBGCS[id]);
	return CreateDefaultThread(SBGThread, (void*)pSBG, &SBGThreadId[id]);
}